

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_compute_sighash(secp256k1_scalar *r,uchar *prehash,size_t index)

{
  bool bVar1;
  int overflow;
  uchar output [32];
  int local_bc;
  byte local_b8 [32];
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  if (index != 0) {
    do {
      local_b8[0] = (byte)index & 0x7f;
      secp256k1_sha256_write(&local_98,local_b8,1);
      bVar1 = 0x7f < index;
      index = index >> 7;
    } while (bVar1);
  }
  secp256k1_sha256_write(&local_98,prehash,0x20);
  secp256k1_sha256_finalize(&local_98,local_b8);
  secp256k1_scalar_set_b32(r,local_b8,&local_bc);
  return (int)(local_bc == 0);
}

Assistant:

static int secp256k1_compute_sighash(secp256k1_scalar *r, const unsigned char *prehash, size_t index) {
    unsigned char output[32];
    int overflow;
    secp256k1_sha256 hasher;
    secp256k1_sha256_initialize(&hasher);
    /* Encode index as a UTF8-style bignum */
    while (index > 0) {
        unsigned char ch = index & 0x7f;
        secp256k1_sha256_write(&hasher, &ch, 1);
        index >>= 7;
    }
    secp256k1_sha256_write(&hasher, prehash, 32);
    secp256k1_sha256_finalize(&hasher, output);
    secp256k1_scalar_set_b32(r, output, &overflow);
    return !overflow;
}